

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result-c.cpp
# Opt level: O2

char * duckdb::CStringConverter::Convert<duckdb::string_t,char_const*>(string_t input)

{
  char *__dest;
  undefined1 *in_RSI;
  uint in_EDI;
  ulong __n;
  undefined1 auStack_34 [12];
  
  __n = (ulong)in_EDI;
  __dest = (char *)malloc(__n + 1);
  if (in_EDI < 0xd) {
    in_RSI = auStack_34;
  }
  switchD_01939fa4::default(__dest,in_RSI,__n);
  __dest[__n] = '\0';
  return __dest;
}

Assistant:

static DST Convert(SRC input) {
		auto result = char_ptr_cast(duckdb_malloc(input.GetSize() + 1));
		assert(result);
		memcpy((void *)result, input.GetData(), input.GetSize());
		auto write_arr = char_ptr_cast(result);
		write_arr[input.GetSize()] = '\0';
		return result;
	}